

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O0

void __thiscall cmCommand::SetError(cmCommand *this,string *e)

{
  string local_38 [32];
  string *local_18;
  string *e_local;
  cmCommand *this_local;
  
  local_18 = e;
  e_local = (string *)this;
  (*(this->super_cmObject)._vptr_cmObject[0xc])(local_38);
  std::__cxx11::string::operator=((string *)&this->Error,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::operator+=((string *)&this->Error," ");
  std::__cxx11::string::operator+=((string *)&this->Error,(string *)local_18);
  return;
}

Assistant:

void SetError(const std::string& e)
    {
    this->Error = this->GetName();
    this->Error += " ";
    this->Error += e;
    }